

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperCanon.c
# Opt level: O0

int Map_CanonComputeSlow
              (uint (*uTruths) [2],int nVarsMax,int nVarsReal,uint *uTruth,uchar *puPhases,
              uint *uTruthRes)

{
  int iVar1;
  uint local_44;
  int local_40;
  int m;
  int nPhases;
  int nMints;
  uint uTruthPerm [2];
  uint *uTruthRes_local;
  uchar *puPhases_local;
  uint *uTruth_local;
  int nVarsReal_local;
  int nVarsMax_local;
  uint (*uTruths_local) [2];
  
  local_40 = 0;
  iVar1 = 1 << ((byte)nVarsReal & 0x1f);
  uTruthPerm = (uint  [2])uTruthRes;
  if (nVarsMax < 6) {
    *uTruthRes = 0xffffffff;
    for (local_44 = 0; (int)local_44 < iVar1; local_44 = local_44 + 1) {
      nPhases = Map_CanonComputePhase(uTruths,nVarsMax,*uTruth,local_44);
      if ((uint)nPhases < *(uint *)uTruthPerm) {
        *(int *)uTruthPerm = nPhases;
        *puPhases = (uchar)local_44;
        local_40 = 1;
      }
      else if ((*(uint *)uTruthPerm == nPhases) && (local_40 < 4)) {
        puPhases[local_40] = (uchar)local_44;
        local_40 = local_40 + 1;
      }
    }
    *(undefined4 *)((long)uTruthPerm + 4) = *(undefined4 *)uTruthPerm;
  }
  else {
    *uTruthRes = 0xffffffff;
    uTruthRes[1] = 0xffffffff;
    for (local_44 = 0; (int)local_44 < iVar1; local_44 = local_44 + 1) {
      Map_CanonComputePhase6(uTruths,nVarsMax,uTruth,local_44,(uint *)&nPhases);
      if (((uint)nMints < *(uint *)((long)uTruthPerm + 4)) ||
         ((*(int *)((long)uTruthPerm + 4) == nMints && ((uint)nPhases < *(uint *)uTruthPerm)))) {
        *(int *)uTruthPerm = nPhases;
        *(int *)((long)uTruthPerm + 4) = nMints;
        *puPhases = (uchar)local_44;
        local_40 = 1;
      }
      else if (((*(int *)((long)uTruthPerm + 4) == nMints) && (*(int *)uTruthPerm == nPhases)) &&
              (local_40 < 4)) {
        puPhases[local_40] = (uchar)local_44;
        local_40 = local_40 + 1;
      }
    }
  }
  if (local_40 < 1) {
    __assert_fail("nPhases > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mapper/mapperCanon.c"
                  ,0x60,
                  "int Map_CanonComputeSlow(unsigned int (*)[2], int, int, unsigned int *, unsigned char *, unsigned int *)"
                 );
  }
  return local_40;
}

Assistant:

int Map_CanonComputeSlow( unsigned uTruths[][2], int nVarsMax, int nVarsReal, unsigned uTruth[], unsigned char * puPhases, unsigned uTruthRes[] )
{
    unsigned  uTruthPerm[2];
    int nMints, nPhases, m;

    nPhases = 0;
    nMints = (1 << nVarsReal);
    if ( nVarsMax < 6 )
    {
        uTruthRes[0] = MAP_MASK(32);
        for ( m = 0; m < nMints; m++ )
        {
            uTruthPerm[0] = Map_CanonComputePhase( uTruths, nVarsMax, uTruth[0], m );
            if ( uTruthRes[0] > uTruthPerm[0] )
            {
                uTruthRes[0] = uTruthPerm[0];
                nPhases      = 0;
                puPhases[nPhases++] = (unsigned char)m;
            }
            else if ( uTruthRes[0] == uTruthPerm[0] )
            {
                if ( nPhases < 4 ) // the max number of phases in Map_Super_t
                    puPhases[nPhases++] = (unsigned char)m;
            }
        }
        uTruthRes[1] = uTruthRes[0];
    }
    else
    {
        uTruthRes[0] = MAP_MASK(32);
        uTruthRes[1] = MAP_MASK(32);
        for ( m = 0; m < nMints; m++ )
        {
            Map_CanonComputePhase6( uTruths, nVarsMax, uTruth, m, uTruthPerm );
            if ( uTruthRes[1] > uTruthPerm[1] || (uTruthRes[1] == uTruthPerm[1] && uTruthRes[0] > uTruthPerm[0]) )
            {
                uTruthRes[0] = uTruthPerm[0];
                uTruthRes[1] = uTruthPerm[1];
                nPhases      = 0;
                puPhases[nPhases++] = (unsigned char)m;
            }
            else if ( uTruthRes[1] == uTruthPerm[1] && uTruthRes[0] == uTruthPerm[0] )
            {
                if ( nPhases < 4 ) // the max number of phases in Map_Super_t
                    puPhases[nPhases++] = (unsigned char)m;
            }
        }
    }
    assert( nPhases > 0 );
//    printf( "%d ", nPhases );
    return nPhases;
}